

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O1

bool __thiscall
duckdb::CatalogSet::VerifyVacancy
          (CatalogSet *this,CatalogTransaction transaction,CatalogEntry *entry)

{
  ulong uVar1;
  pointer pcVar2;
  TransactionException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  uVar1 = (entry->timestamp).super___atomic_base<unsigned_long>._M_i;
  if (((uVar1 < 0x4000000000000060) || (transaction.transaction_id == uVar1)) &&
     ((0x400000000000005f < uVar1 || (uVar1 <= transaction.start_time)))) {
    return entry->deleted;
  }
  this_00 = (TransactionException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Catalog write-write conflict on create with \"%s\"","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  pcVar2 = (entry->name)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + (entry->name)._M_string_length);
  TransactionException::TransactionException<std::__cxx11::string>(this_00,&local_48,&local_68);
  __cxa_throw(this_00,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool CatalogSet::VerifyVacancy(CatalogTransaction transaction, CatalogEntry &entry) {
	if (HasConflict(transaction, entry.timestamp)) {
		// A transaction that is not visible to our snapshot has already made a change to this entry.
		// Because of Catalog limitations we can't push our change on this, even if the change was made by another
		// active transaction that might end up being aborted. So we have to cancel this transaction.
		throw TransactionException("Catalog write-write conflict on create with \"%s\"", entry.name);
	}
	// The entry is visible to our snapshot
	if (!entry.deleted) {
		return false;
	}
	return true;
}